

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O2

PatternBlock * TokenPattern::buildLittleBlock(int4 size,int4 bitstart,int4 bitend,intb value)

{
  PatternBlock *pPVar1;
  PatternBlock *pPVar2;
  PatternBlock *pPVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint startbit;
  uint startbit_00;
  
  startbit = (bitstart / 8) * 8;
  uVar5 = (bitend / 8) * 8;
  iVar6 = (int)((long)bitstart % 8);
  if (startbit != uVar5) {
    pPVar1 = buildSingle(startbit,(startbit - iVar6) + 7,(uintm)value);
    lVar4 = value >> (8U - (char)((long)bitstart % 8) & 0x3f);
    while( true ) {
      startbit_00 = startbit + 8;
      if (uVar5 == startbit_00) break;
      pPVar2 = buildSingle(startbit_00,startbit + 0xf,(uintm)lVar4);
      if (pPVar1 != (PatternBlock *)0x0) {
        pPVar3 = PatternBlock::intersect(pPVar1,pPVar2);
        PatternBlock::~PatternBlock(pPVar1);
        operator_delete(pPVar1);
        PatternBlock::~PatternBlock(pPVar2);
        operator_delete(pPVar2);
        pPVar2 = pPVar3;
      }
      pPVar1 = pPVar2;
      lVar4 = lVar4 >> 8;
      startbit = startbit_00;
    }
    pPVar2 = buildSingle((uVar5 - bitend % 8) + 7,uVar5 | 7,(uintm)lVar4);
    if (pPVar1 != (PatternBlock *)0x0) {
      pPVar3 = PatternBlock::intersect(pPVar1,pPVar2);
      PatternBlock::~PatternBlock(pPVar1);
      operator_delete(pPVar1);
      PatternBlock::~PatternBlock(pPVar2);
      operator_delete(pPVar2);
      pPVar2 = pPVar3;
    }
    return pPVar2;
  }
  pPVar1 = buildSingle((startbit - bitend % 8) + 7,(startbit - iVar6) + 7,(uintm)value);
  return pPVar1;
}

Assistant:

PatternBlock *TokenPattern::buildLittleBlock(int4 size,int4 bitstart,int4 bitend,intb value)

{				// Build pattern block given a littleendian contiguous
				// range of bits and a value for those bits
  PatternBlock *tmpblock,*block;
  int4 startbit,endbit;

  block = (PatternBlock *)0;

  // we need to convert a bit range specified on a little endian token where the
  // bit indices label the least sig bit as 0 into a bit range on big endian bytes
  // where the indices label the most sig bit as 0.  The reversal due to
  // little->big endian cancels part of the reversal due to least->most sig bit
  // labelling, but not on the lower 3 bits.  So the transform becomes
  // leave the upper bits the same, but transform the lower 3-bit value x into 7-x.

  startbit = (bitstart/8) * 8;	// Get the high-order portion of little/LSB labelling
  endbit = (bitend/8) * 8;
  bitend = bitend % 8;		// Get the low-order portion of little/LSB labelling
  bitstart = bitstart % 8;

  if (startbit == endbit) {
    startbit += 7 - bitend;
    endbit += 7 - bitstart;
    block = buildSingle(startbit,endbit,(uintm)value);
  }
  else {
    block = buildSingle(startbit,startbit+(7-bitstart),(uintm)value);
    value >>= (8-bitstart);	// Cut off bits we just encoded
    startbit += 8;
    while(startbit != endbit) {
      tmpblock = buildSingle(startbit,startbit+7,(uintm)value);
      if (block == (PatternBlock *)0)
	block = tmpblock;
      else {
	PatternBlock *newblock = block->intersect(tmpblock);
	delete block;
	delete tmpblock;
	block = newblock;
      }
      value >>= 8;
      startbit += 8;
    }
    tmpblock = buildSingle(endbit+(7-bitend),endbit+7,(uintm)value);
    if (block == (PatternBlock *)0)
      block = tmpblock;
    else {
      PatternBlock *newblock = block->intersect(tmpblock);
      delete block;
      delete tmpblock;
      block = newblock;
    }
  }
  return block;
}